

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O1

void __thiscall jpgd::jpeg_decoder::H2V2Convert(jpeg_decoder *this)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  uint8 *puVar6;
  uint8 *puVar7;
  uint8 *puVar8;
  int iVar9;
  long lVar10;
  uint uVar11;
  int iVar12;
  uint8 *puVar13;
  uint8 *puVar14;
  uint8 *puVar15;
  int iVar16;
  ulong uVar17;
  uint8 *puVar18;
  uint8 *puVar19;
  bool bVar20;
  
  if (0 < this->m_max_mcus_per_row) {
    lVar10 = (long)this->m_max_mcu_y_size - (long)this->m_mcu_lines_left;
    uVar11 = (uint)lVar10;
    lVar4 = (ulong)(uVar11 & 7) * 8 + 0x80;
    if ((int)uVar11 < 8) {
      lVar4 = lVar10 * 8;
    }
    puVar6 = this->m_pSample_buf + lVar4;
    puVar18 = this->m_pScan_line_1;
    puVar19 = this->m_pScan_line_0;
    puVar13 = this->m_pSample_buf + (long)(int)(uVar11 * 4 & 0xfffffff8) + 0x100;
    iVar3 = this->m_max_mcus_per_row;
    do {
      iVar9 = 0;
      do {
        puVar14 = puVar13;
        puVar7 = puVar6;
        uVar17 = 0xfffffffffffffffe;
        puVar6 = puVar18;
        puVar13 = puVar19;
        lVar4 = 0;
        do {
          lVar10 = lVar4;
          puVar15 = puVar13;
          puVar8 = puVar6;
          iVar5 = this->m_crr[puVar14[lVar10 + 0x40]];
          uVar11 = (uint)puVar7[lVar10 * 2];
          iVar12 = iVar5 + uVar11;
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          iVar16 = this->m_cbg[puVar14[lVar10]] + this->m_crg[puVar14[lVar10 + 0x40]] >> 0x10;
          iVar2 = this->m_cbb[puVar14[lVar10]];
          puVar19[lVar10 * 8] = (uint8)iVar12;
          iVar12 = iVar16 + uVar11;
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          puVar19[lVar10 * 8 + 1] = (uint8)iVar12;
          iVar12 = uVar11 + iVar2;
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          puVar19[lVar10 * 8 + 2] = (uint8)iVar12;
          puVar19[lVar10 * 8 + 3] = 0xff;
          uVar11 = (uint)puVar7[lVar10 * 2 + 1];
          iVar12 = iVar5 + uVar11;
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          puVar19[lVar10 * 8 + 4] = (uint8)iVar12;
          iVar12 = iVar16 + uVar11;
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          puVar19[lVar10 * 8 + 5] = (uint8)iVar12;
          iVar12 = uVar11 + iVar2;
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          puVar19[lVar10 * 8 + 6] = (uint8)iVar12;
          puVar19[lVar10 * 8 + 7] = 0xff;
          uVar11 = (uint)puVar7[lVar10 * 2 + 8];
          iVar12 = iVar5 + uVar11;
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          puVar18[lVar10 * 8] = (uint8)iVar12;
          iVar12 = iVar16 + uVar11;
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          puVar18[lVar10 * 8 + 1] = (uint8)iVar12;
          iVar12 = uVar11 + iVar2;
          if (iVar12 < 1) {
            iVar12 = 0;
          }
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          puVar18[lVar10 * 8 + 2] = (uint8)iVar12;
          puVar18[lVar10 * 8 + 3] = 0xff;
          bVar1 = puVar7[lVar10 * 2 + 9];
          iVar5 = iVar5 + (uint)bVar1;
          if (iVar5 < 1) {
            iVar5 = 0;
          }
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          puVar18[lVar10 * 8 + 4] = (uint8)iVar5;
          iVar16 = iVar16 + (uint)bVar1;
          if (iVar16 < 1) {
            iVar16 = 0;
          }
          if (0xfe < iVar16) {
            iVar16 = 0xff;
          }
          puVar18[lVar10 * 8 + 5] = (uint8)iVar16;
          iVar12 = 0;
          if (0 < (int)(iVar2 + (uint)bVar1)) {
            iVar12 = iVar2 + (uint)bVar1;
          }
          if (0xfe < iVar12) {
            iVar12 = 0xff;
          }
          puVar18[lVar10 * 8 + 6] = (uint8)iVar12;
          puVar18[lVar10 * 8 + 7] = 0xff;
          uVar17 = uVar17 + 2;
          puVar6 = puVar18 + lVar10 * 8 + 8;
          puVar13 = puVar19 + lVar10 * 8 + 8;
          lVar4 = lVar10 + 1;
        } while (uVar17 < 6);
        puVar19 = puVar15 + 8;
        puVar18 = puVar8 + 8;
        bVar20 = iVar9 == 0;
        puVar6 = puVar7 + 0x40;
        puVar13 = puVar14 + lVar10 + 1;
        iVar9 = iVar9 + 1;
      } while (bVar20);
      puVar6 = puVar7 + 0x140;
      puVar13 = puVar14 + lVar10 + 0x179;
      bVar20 = 1 < iVar3;
      iVar3 = iVar3 + -1;
    } while (bVar20);
  }
  return;
}

Assistant:

void jpeg_decoder::H2V2Convert()
	{
		int row = m_max_mcu_y_size - m_mcu_lines_left;
		uint8* d0 = m_pScan_line_0;
		uint8* d1 = m_pScan_line_1;
		uint8* y;
		uint8* c;

		if (row < 8)
			y = m_pSample_buf + row * 8;
		else
			y = m_pSample_buf + 64 * 2 + (row & 7) * 8;

		c = m_pSample_buf + 64 * 4 + (row >> 1) * 8;

		for (int i = m_max_mcus_per_row; i > 0; i--)
		{
			for (int l = 0; l < 2; l++)
			{
				for (int j = 0; j < 8; j += 2)
				{
					int cb = c[0];
					int cr = c[64];

					int rc = m_crr[cr];
					int gc = ((m_crg[cr] + m_cbg[cb]) >> 16);
					int bc = m_cbb[cb];

					int yy = y[j];
					d0[0] = clamp(yy + rc);
					d0[1] = clamp(yy + gc);
					d0[2] = clamp(yy + bc);
					d0[3] = 255;

					yy = y[j + 1];
					d0[4] = clamp(yy + rc);
					d0[5] = clamp(yy + gc);
					d0[6] = clamp(yy + bc);
					d0[7] = 255;

					yy = y[j + 8];
					d1[0] = clamp(yy + rc);
					d1[1] = clamp(yy + gc);
					d1[2] = clamp(yy + bc);
					d1[3] = 255;

					yy = y[j + 8 + 1];
					d1[4] = clamp(yy + rc);
					d1[5] = clamp(yy + gc);
					d1[6] = clamp(yy + bc);
					d1[7] = 255;

					d0 += 8;
					d1 += 8;

					c++;
				}
				y += 64;
			}

			y += 64 * 6 - 64 * 2;
			c += 64 * 6 - 8;
		}
	}